

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QObject * parentObject(QObject *obj)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  QMetaType QVar5;
  anon_union_24_3_e3d07ef4_for_data *paVar6;
  long in_FS_OFFSET;
  QObject *t;
  QMetaType local_50;
  QMetaType local_48;
  anon_union_24_3_e3d07ef4_for_data local_40;
  byte local_28;
  undefined7 uStack_27;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
  if (lVar3 != 0) {
    (*(code *)**(undefined8 **)obj)(obj);
    pcVar4 = (char *)QMetaObject::className();
    iVar2 = qstrcmp(pcVar4,"QTipLabel");
    if (iVar2 == 0) {
      paVar6 = &local_40;
      QObject::property((char *)paVar6->data);
      local_48.d_ptr =
           (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QObject*>::metaType;
      local_50.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_27,local_28) & 0xfffffffffffffffc);
      bVar1 = comparesEqual(&local_50,&local_48);
      if (bVar1) {
        if ((local_28 & 1) != 0) {
          local_40.shared =
               (PrivateShared *)*(undefined8 *)(local_40.shared + *(int *)(local_40.shared + 4));
        }
      }
      else {
        local_50.d_ptr = (QMetaTypeInterface *)0x0;
        QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
        if ((local_28 & 1) != 0) {
          paVar6 = (anon_union_24_3_e3d07ef4_for_data *)
                   (local_40.shared + *(int *)(local_40.shared + 4));
        }
        QMetaType::convert(QVar5,paVar6,local_48,&local_50);
        local_40.shared = (PrivateShared *)local_50.d_ptr;
      }
      QVariant::~QVariant((QVariant *)&local_40);
      if ((QMetaTypeInterface *)local_40.shared != (QMetaTypeInterface *)0x0) goto LAB_00359d3d;
    }
  }
  local_40.shared = (PrivateShared *)*(undefined8 *)(*(long *)(obj + 8) + 0x10);
LAB_00359d3d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (QObject *)(QMetaTypeInterface *)local_40.shared;
}

Assistant:

static inline QObject *parentObject(const QObject *obj)
{
#if QT_CONFIG(tooltip)
    if (qobject_cast<const QLabel *>(obj) && qstrcmp(obj->metaObject()->className(), "QTipLabel") == 0) {
        QObject *p = qvariant_cast<QObject *>(obj->property("_q_stylesheet_parent"));
        if (p)
            return p;
    }
#endif
    return obj->parent();
}